

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O0

int cmd_cat(char *args)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  undefined8 uVar4;
  ulong uVar5;
  long local_b8;
  PHYSFS_sint64 i;
  PHYSFS_sint64 rc;
  char buffer [128];
  PHYSFS_File *f;
  char *args_local;
  
  f = (PHYSFS_File *)args;
  if (*args == '\"') {
    f = (PHYSFS_File *)(args + 1);
    sVar2 = strlen((char *)f);
    *(char *)((long)f + (sVar2 - 1)) = '\0';
  }
  lVar3 = PHYSFS_openRead(f);
  if (lVar3 == 0) {
    uVar4 = PHYSFS_getLastError();
    printf("failed to open. Reason: [%s].\n",uVar4);
  }
  else if ((do_buffer_size == 0) || (iVar1 = PHYSFS_setBuffer(lVar3,do_buffer_size), iVar1 != 0)) {
    do {
      uVar5 = PHYSFS_readBytes(lVar3,&rc,0x80);
      for (local_b8 = 0; local_b8 < (long)uVar5; local_b8 = local_b8 + 1) {
        fputc((int)buffer[local_b8 + -8],_stdout);
      }
    } while (0x7f < uVar5);
    printf("\n\n");
    iVar1 = PHYSFS_eof(lVar3);
    if (iVar1 == 0) {
      uVar4 = PHYSFS_getLastError();
      printf("\n (Error condition in reading. Reason: [%s])\n\n",uVar4);
    }
    PHYSFS_close(lVar3);
  }
  else {
    uVar4 = PHYSFS_getLastError();
    printf("failed to set file buffer. Reason: [%s].\n",uVar4);
    PHYSFS_close(lVar3);
  }
  return 1;
}

Assistant:

static int cmd_cat(char *args)
{
    PHYSFS_File *f;

    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    f = PHYSFS_openRead(args);
    if (f == NULL)
        printf("failed to open. Reason: [%s].\n", PHYSFS_getLastError());
    else
    {
        if (do_buffer_size)
        {
            if (!PHYSFS_setBuffer(f, do_buffer_size))
            {
                printf("failed to set file buffer. Reason: [%s].\n",
                        PHYSFS_getLastError());
                PHYSFS_close(f);
                return 1;
            } /* if */
        } /* if */

        while (1)
        {
            char buffer[128];
            PHYSFS_sint64 rc;
            PHYSFS_sint64 i;
            rc = PHYSFS_readBytes(f, buffer, sizeof (buffer));

            for (i = 0; i < rc; i++)
                fputc((int) buffer[i], stdout);

            if (rc < sizeof (buffer))
            {
                printf("\n\n");
                if (!PHYSFS_eof(f))
                {
                    printf("\n (Error condition in reading. Reason: [%s])\n\n",
                           PHYSFS_getLastError());
                } /* if */
                PHYSFS_close(f);
                return 1;
            } /* if */
        } /* while */
    } /* else */

    return 1;
}